

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O0

void __thiscall glslang::TIntermediate::setAtomicCounterBlockName(TIntermediate *this,char *name)

{
  allocator<char> local_39;
  string local_38 [32];
  char *local_18;
  char *name_local;
  TIntermediate *this_local;
  
  local_18 = name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,name,&local_39);
  std::__cxx11::string::operator=((string *)&this->atomicCounterBlockName,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void setAtomicCounterBlockName(const char* name) { atomicCounterBlockName = std::string(name); }